

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_DerefOp_Test::TestBody(StatePointer_DerefOp_Test *this)

{
  bool bVar1;
  reference_type piVar2;
  reference_type piVar3;
  char *pcVar4;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  state_ptr<int,_unsigned_long,_2UL> p2;
  state_ptr<int,_unsigned_long,_2UL> p1b;
  state_ptr<int,_unsigned_long,_2UL> p1a;
  int foo2;
  int foo1;
  StatePointer_DerefOp_Test *this_local;
  
  p1a.m_ptr_and_state._4_4_ = 0x2a;
  p1a.m_ptr_and_state._0_4_ = 0x539;
  putl::state_ptr<int,_unsigned_long,_2UL>::state_ptr
            (&p1b,(pointer_type)((long)&p1a.m_ptr_and_state + 4),1);
  putl::state_ptr<int,_unsigned_long,_2UL>::state_ptr
            (&p2,(pointer_type)((long)&p1a.m_ptr_and_state + 4),1);
  putl::state_ptr<int,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<int,_unsigned_long,_2UL> *)&gtest_ar.message_,(pointer_type)&p1a,1);
  piVar2 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*(&p1b);
  piVar3 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*(&p2);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_40,"*p1a","*p1b",piVar2,piVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  piVar2 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*(&p1b);
  piVar3 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*
                     ((state_ptr<int,_unsigned_long,_2UL> *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<int,int>((internal *)local_70,"*p1a","*p2",piVar2,piVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  piVar2 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*(&p2);
  piVar3 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*
                     ((state_ptr<int,_unsigned_long,_2UL> *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<int,int>((internal *)local_90,"*p1b","*p2",piVar2,piVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x7d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(StatePointer, DerefOp) {
	int foo1{42};
	int foo2{1337};
	state_ptr<int> p1a{&foo1, 1};
	state_ptr<int> p1b{&foo1, 1};
	state_ptr<int> p2 {&foo2, 1};
	EXPECT_EQ(*p1a, *p1b);
	EXPECT_NE(*p1a, *p2);
	EXPECT_NE(*p1b, *p2);
}